

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<float,1,-1,1,1,-1>>,3,0>
       ::run<Eigen::Matrix<float,1,_1,1,1,_1>>
                 (redux_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *eval,
                 scalar_max_op<float,_float,_0> *func,Matrix<float,_1,__1,_1,_1,__1> *xpr)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  CoeffReturnType pfVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  float afVar4 [4];
  long local_e0;
  Index index_3;
  Index index_2;
  Index index_1;
  float local_b8 [4];
  float local_a8 [4];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  Matrix<float,_1,__1,_1,_1,__1> *xpr_local;
  scalar_max_op<float,_float,_0> *func_local;
  redux_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *eval_local;
  
  IVar1 = EigenBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>::size
                    ((EigenBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *)xpr);
  index_00 = first_default_aligned<Eigen::Matrix<float,1,_1,1,1,_1>>
                       ((DenseBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *)xpr);
  lVar2 = ((IVar1 - index_00) / 4) * 4;
  index_01 = index_00 + ((IVar1 - index_00) / 8) * 8;
  index_3 = index_00 + lVar2;
  if (lVar2 == 0) {
    pfVar3 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>::coeff
                       ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>
                         *)eval,0);
    packet_res0[3] = *pfVar3;
    for (local_e0 = 1; local_e0 < IVar1; local_e0 = local_e0 + 1) {
      pfVar3 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>::coeff
                         ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>
                           *)eval,local_e0);
      packet_res0[3] = scalar_max_op<float,_float,_0>::operator()(func,packet_res0 + 3,pfVar3);
    }
  }
  else {
    afVar4 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,-1,1,1,-1>>>::
             packet<16,float__vector(4)>
                       ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,_1,1,1,_1>>> *)eval,
                        index_00);
    unique0x100000b3 = extraout_XMM0_Dc;
    packet_res1._8_8_ = afVar4._0_8_;
    unique0x100000b7 = extraout_XMM0_Dd;
    if (4 < lVar2) {
      afVar4 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,-1,1,1,-1>>>::
               packet<16,float__vector(4)>
                         ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,_1,1,1,_1>>> *)
                          eval,index_00 + 4);
      unique0x100000d7 = (float)extraout_XMM0_Dc_00;
      index._0_4_ = (float)(int)afVar4._0_8_;
      index._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
      unique0x100000db = extraout_XMM0_Dd_00;
      local_90 = index_00;
      while (local_90 = local_90 + 8, local_90 < index_01) {
        afVar4 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,-1,1,1,-1>>>::
                 packet<16,float__vector(4)>
                           ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,_1,1,1,_1>>> *)
                            eval,local_90);
        local_a8[2] = (float)extraout_XMM0_Dc_01;
        local_a8[0] = (float)(int)afVar4._0_8_;
        local_a8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
        local_a8[3] = extraout_XMM0_Dd_01;
        afVar4 = scalar_max_op<float,float,0>::packetOp<float__vector(4)>
                           ((scalar_max_op<float,float,0> *)func,(float (*) [4])(packet_res1 + 2),
                            &local_a8);
        unique0x1000011f = extraout_XMM0_Dc_02;
        packet_res1._8_8_ = afVar4._0_8_;
        unique0x10000123 = extraout_XMM0_Dd_02;
        afVar4 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,-1,1,1,-1>>>::
                 packet<16,float__vector(4)>
                           ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,_1,1,1,_1>>> *)
                            eval,local_90 + 4);
        local_b8[2] = (float)extraout_XMM0_Dc_03;
        local_b8[0] = (float)(int)afVar4._0_8_;
        local_b8[1] = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
        local_b8[3] = extraout_XMM0_Dd_03;
        afVar4 = scalar_max_op<float,float,0>::packetOp<float__vector(4)>
                           ((scalar_max_op<float,float,0> *)func,(float (*) [4])&index,&local_b8);
        unique0x10000167 = (float)extraout_XMM0_Dc_04;
        index._0_4_ = (float)(int)afVar4._0_8_;
        index._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
        unique0x1000016b = extraout_XMM0_Dd_04;
      }
      afVar4 = scalar_max_op<float,float,0>::packetOp<float__vector(4)>
                         ((scalar_max_op<float,float,0> *)func,(float (*) [4])(packet_res1 + 2),
                          (float (*) [4])&index);
      unique0x1000018b = extraout_XMM0_Dc_05;
      packet_res1._8_8_ = afVar4._0_8_;
      unique0x1000018f = extraout_XMM0_Dd_05;
      if (index_01 < index_3) {
        afVar4 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,-1,1,1,-1>>>::
                 packet<16,float__vector(4)>
                           ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,1,_1,1,1,_1>>> *)
                            eval,index_01);
        unique0x100001af = (float)extraout_XMM0_Dc_06;
        index_1._0_4_ = (float)(int)afVar4._0_8_;
        index_1._4_4_ = (float)(int)((ulong)afVar4._0_8_ >> 0x20);
        unique0x100001b3 = extraout_XMM0_Dd_06;
        afVar4 = scalar_max_op<float,float,0>::packetOp<float__vector(4)>
                           ((scalar_max_op<float,float,0> *)func,(float (*) [4])(packet_res1 + 2),
                            (float (*) [4])&index_1);
        unique0x100001d3 = extraout_XMM0_Dc_07;
        packet_res1._8_8_ = afVar4._0_8_;
        unique0x100001d7 = extraout_XMM0_Dd_07;
      }
    }
    packet_res0[3] =
         scalar_max_op<float,float,0>::predux<float__vector(4)>
                   ((scalar_max_op<float,float,0> *)func,(float (*) [4])(packet_res1 + 2));
    for (index_2 = 0; index_2 < index_00; index_2 = index_2 + 1) {
      pfVar3 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>::coeff
                         ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>
                           *)eval,index_2);
      packet_res0[3] = scalar_max_op<float,_float,_0>::operator()(func,packet_res0 + 3,pfVar3);
    }
    for (; index_3 < IVar1; index_3 = index_3 + 1) {
      pfVar3 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>_>::coeff
                         ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>
                           *)eval,index_3);
      packet_res0[3] = scalar_max_op<float,_float,_0>::operator()(func,packet_res0 + 3,pfVar3);
    }
  }
  return packet_res0[3];
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }